

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::addToMatrix(HPresolve *this,HighsInt row,HighsInt col,double val)

{
  pointer piVar1;
  uint uVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__to;
  ulong uVar3;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar4;
  int local_54;
  HighsInt local_50;
  HighsInt local_4c;
  undefined1 local_48 [16];
  double local_38;
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = val;
  local_48._12_4_ = in_XMM0_Dd;
  local_50 = row;
  local_4c = col;
  local_38 = val;
  uVar2 = findNonzero(this,row,col);
  markChangedRow(this,row);
  markChangedCol(this,col);
  if (uVar2 == 0xffffffff) {
    piVar1 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start == piVar1) {
      uVar3 = (ulong)((long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3;
      std::vector<double,_std::allocator<double>_>::push_back(&this->Avalue,&local_38);
      std::vector<int,_std::allocator<int>_>::push_back(&this->Arow,&local_50);
      std::vector<int,_std::allocator<int>_>::push_back(&this->Acol,&local_4c);
      local_54 = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Anext,&local_54);
      local_54 = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Aprev,&local_54);
      local_54 = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->ARleft,&local_54);
      local_54 = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->ARright,&local_54);
      __to = extraout_RDX_00;
    }
    else {
      uVar3 = (ulong)piVar1[-1];
      (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar1 + -1;
      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (double)local_48._0_8_;
      (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = row;
      (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = col;
      (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = -1;
      __to = extraout_RDX;
    }
    link(this,(char *)(uVar3 & 0xffffffff),__to);
    resetRowDualImpliedBoundsDerivedFromCol(this,local_4c);
    resetColImpliedBoundsDerivedFromRow(this,local_50);
    clearLiftingOpportunities(this,local_50);
    return;
  }
  dVar4 = (double)local_48._0_8_ +
          (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar2];
  if ((this->options->super_HighsOptionsStruct).small_matrix_value < ABS(dVar4)) {
    local_48._0_8_ = dVar4;
    resetRowDualImpliedBoundsDerivedFromCol(this,col);
    resetColImpliedBoundsDerivedFromRow(this,row);
    clearLiftingOpportunities(this,row);
    HighsLinearSumBounds::remove(&this->impliedRowBounds,(char *)(ulong)(uint)row);
    HighsLinearSumBounds::remove(&this->impliedDualRowBounds,(char *)(ulong)(uint)col);
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar2] = (double)local_48._0_8_;
    HighsLinearSumBounds::add(&this->impliedRowBounds,row,col,(double)local_48._0_8_);
    HighsLinearSumBounds::add
              (&this->impliedDualRowBounds,col,row,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar2]);
    return;
  }
  unlink(this,(char *)(ulong)uVar2);
  return;
}

Assistant:

void HPresolve::addToMatrix(const HighsInt row, const HighsInt col,
                            const double val) {
  HighsInt pos = findNonzero(row, col);

  markChangedRow(row);
  markChangedCol(col);

  if (pos == -1) {
    if (freeslots.empty()) {
      pos = Avalue.size();
      Avalue.push_back(val);
      Arow.push_back(row);
      Acol.push_back(col);
      Anext.push_back(-1);
      Aprev.push_back(-1);
      ARleft.push_back(-1);
      ARright.push_back(-1);
    } else {
      pos = freeslots.back();
      freeslots.pop_back();
      Avalue[pos] = val;
      Arow[pos] = row;
      Acol[pos] = col;
      Aprev[pos] = -1;
    }

    link(pos);

    // remove implied bounds on row duals that where implied by this column's
    // dual constraint
    resetRowDualImpliedBoundsDerivedFromCol(col);

    // remove implied bounds on columns that where implied by this row
    resetColImpliedBoundsDerivedFromRow(row);

    // modifications to row invalidate lifting opportunities
    clearLiftingOpportunities(row);

  } else {
    double sum = Avalue[pos] + val;
    if (std::abs(sum) <= options->small_matrix_value) {
      unlink(pos);
    } else {
      // remove implied bounds on row duals that where implied by this column's
      // dual constraint
      resetRowDualImpliedBoundsDerivedFromCol(col);

      // remove implied bounds on columns that where implied by this row
      resetColImpliedBoundsDerivedFromRow(row);

      // modifications to row invalidate lifting opportunities
      clearLiftingOpportunities(row);

      // remove the locks and contribution to implied (dual) row bounds, then
      // add then again
      impliedRowBounds.remove(row, col, Avalue[pos]);
      impliedDualRowBounds.remove(col, row, Avalue[pos]);
      Avalue[pos] = sum;
      // value not zero, add new contributions and locks with opposite sign
      impliedRowBounds.add(row, col, Avalue[pos]);
      impliedDualRowBounds.add(col, row, Avalue[pos]);
    }
  }
}